

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O0

bool __thiscall iutest::TestResult::Skipped(TestResult *this)

{
  bool bVar1;
  pointer pTVar2;
  __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
  local_28;
  const_iterator end;
  const_iterator it;
  TestResult *this_local;
  
  end = std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::begin
                  (&this->m_test_part_results);
  local_28._M_current =
       (TestPartResult *)
       std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::end
                 (&this->m_test_part_results);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_28);
    if (!bVar1) {
      return false;
    }
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
             ::operator->(&end);
    bVar1 = TestPartResult::skipped(pTVar2);
    if (bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
             ::operator->(&end);
    bVar1 = TestPartResult::assume_failed(pTVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
    ::operator++(&end);
  }
  bVar1 = Passed(this);
  return bVar1;
}

Assistant:

bool        Skipped() const
    {
        for( TestPartResults::const_iterator it=m_test_part_results.begin()
            , end=m_test_part_results.end(); it != end; ++it )
        {
            if( it->skipped() || it->assume_failed() )
            {
                return Passed();
            }
        }
        return false;
    }